

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNInhClass::gen_code_member
          (CTPNInhClass *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,
          int varargs,CTcNamedArgs *named_args)

{
  short sVar1;
  int iVar2;
  CTcSymbol *pCVar3;
  undefined4 in_ECX;
  size_t __n;
  long *in_RDX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  CTcGenTarg *in_RDI;
  int in_R8D;
  int in_R9D;
  vm_obj_id_t obj;
  CTcSymbol *objsym;
  vm_prop_id_t prop;
  uchar in_stack_000000af;
  CTcGenTarg *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  CTcPrsSymtab *in_stack_ffffffffffffffd0;
  
  iVar2 = CTcCodeStream::is_self_available(G_cs);
  if (iVar2 == 0) {
    CTcTokenizer::log_error(0x2cef);
  }
  iVar2 = CTcGenTarg::is_speculative(G_cg);
  if (iVar2 != 0) {
    err_throw(0);
  }
  CTcCodeStream::get_symtab(G_cs);
  __n = 0;
  pCVar3 = CTcPrsSymtab::find_or_def_undef
                     (in_stack_ffffffffffffffd0,
                      (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      (size_t)in_RDI,in_stack_ffffffffffffffbc);
  iVar2 = (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
            [0x17])();
  if (iVar2 == 0) {
    CTcTokenizer::log_error(0x2cfe,in_RDI->max_list_cnt_ & 0xffffffff,in_RDI->max_str_len_);
  }
  else {
    sVar1 = (**(code **)(*in_RDX + 200))(in_RDX,0,in_ECX);
    if (sVar1 == 0) {
      if (in_R9D != 0) {
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      }
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf_00,__n);
      CTcDataStream::write_obj_id
                ((CTcDataStream *)in_RDI,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      CTcGenTarg::note_pop(G_cg,in_R8D + 1);
    }
    else {
      if (in_R9D != 0) {
        CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      }
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcDataStream::write(&G_cs->super_CTcDataStream,(int)(char)in_R8D,__buf,__n);
      CTcDataStream::write_prop_id((CTcDataStream *)in_RDI,in_stack_ffffffffffffffbc);
      CTcDataStream::write_obj_id
                ((CTcDataStream *)in_RDI,
                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      CTcGenTarg::note_pop(G_cg,in_R8D);
    }
    CTcGenTarg::post_call_cleanup
              (in_RDI,(CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
    ;
    if (in_ESI == 0) {
      CTcGenTarg::write_op(in_stack_000000b0,in_stack_000000af);
      CTcGenTarg::note_push((CTcGenTarg *)0x27cb00);
    }
  }
  return;
}

Assistant:

void CTPNInhClass::gen_code_member(int discard,
                                   CTcPrsNode *prop_expr, int prop_is_expr,
                                   int argc, int varargs,
                                   CTcNamedArgs *named_args)
{
    vm_prop_id_t prop;
    CTcSymbol *objsym;
    vm_obj_id_t obj;

    /* 
     *   make sure "self" is available - we obviously can't inherit
     *   anything if we're not in an object's method 
     */
    if (!G_cs->is_self_available())
        G_tok->log_error(TCERR_SELF_NOT_AVAIL);

    /* don't allow 'inherited' in speculative evaluation mode */
    if (G_cg->is_speculative())
        err_throw(VMERR_BAD_SPEC_EVAL);

    /* get the superclass name symbol */
    objsym = G_cs->get_symtab()->find_or_def_undef(sym_, len_, FALSE);
    
    /* if it's not an object, we can't inherit from it */
    obj = objsym->get_val_obj();
    if (obj == VM_INVALID_OBJ)
    {
        G_tok->log_error(TCERR_INH_NOT_OBJ, (int)len_, sym_);
        return;
    }

    /* generate the property value */
    prop = prop_expr->gen_code_propid(FALSE, prop_is_expr);

    /* 
     *   if we got a property ID, generate a simple EXPINHERIT; otherwise,
     *   generate a PTREXPINHERIT 
     */
    if (prop != VM_INVALID_PROP)
    {
        /* add a varargs modifier if needed */
        if (varargs)
            G_cg->write_op(OPC_VARARGC);
        
        /* we have a constant property ID - generate a regular EXPINHERIT */
        G_cg->write_op(OPC_EXPINHERIT);
        G_cs->write((char)argc);
        G_cs->write_prop_id(prop);
        G_cs->write_obj_id(obj);

        /* this removes argumnts */
        G_cg->note_pop(argc);
    }
    else
    {
        /* 
         *   if we have a varargs list, modify the call instruction that
         *   follows to make it a varargs call 
         */
        if (varargs)
        {
            /* swap the top of the stack to get the arg counter back on top */
            G_cg->write_op(OPC_SWAP);
            
            /* write the varargs modifier */
            G_cg->write_op(OPC_VARARGC);
        }
        
        /* a property pointer is on the stack - write a PTREXPINHERIT */
        G_cg->write_op(OPC_PTREXPINHERIT);
        G_cs->write((int)argc);
        G_cs->write_obj_id(obj);

        /* this removes arguments and the property pointer */
        G_cg->note_pop(argc + 1);
    }

    /* do post-call cleanup: named arg removal, etc */
    G_cg->post_call_cleanup(named_args);

    /* if the result is needed, push it */
    if (!discard)
    {
        G_cg->write_op(OPC_GETR0);
        G_cg->note_push();
    }
}